

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

float128 int64_to_float128_riscv64(int64_t a,float_status *status)

{
  int iVar1;
  uint64_t local_58;
  uint64_t local_50;
  uint64_t zSig1;
  uint64_t zSig0;
  int32_t zExp;
  int8_t shiftCount;
  uint64_t absA;
  float_status *pfStack_28;
  flag zSign;
  float_status *status_local;
  int64_t a_local;
  
  pfStack_28 = status;
  status_local = (float_status *)a;
  if (a == 0) {
    _a_local = packFloat128('\0',0,0,0);
  }
  else {
    absA._7_1_ = a < 0;
    local_58 = a;
    if ((bool)absA._7_1_) {
      local_58 = -a;
    }
    _zExp = local_58;
    iVar1 = clz64(local_58);
    zSig0._7_1_ = (char)iVar1 + '1';
    zSig0._0_4_ = 0x406e - zSig0._7_1_;
    if (zSig0._7_1_ < '@') {
      local_50 = _zExp;
      zSig1 = 0;
    }
    else {
      local_50 = 0;
      zSig1 = _zExp;
      zSig0._7_1_ = (char)iVar1 + -0xf;
    }
    shortShift128Left(zSig1,local_50,(int)zSig0._7_1_,&zSig1,&local_50);
    _a_local = packFloat128(absA._7_1_,(int)zSig0,zSig1,local_50);
  }
  return _a_local;
}

Assistant:

float128 int64_to_float128(int64_t a, float_status *status)
{
    flag zSign;
    uint64_t absA;
    int8_t shiftCount;
    int32_t zExp;
    uint64_t zSig0, zSig1;

    if ( a == 0 ) return packFloat128( 0, 0, 0, 0 );
    zSign = ( a < 0 );
    absA = zSign ? - a : a;
    shiftCount = clz64(absA) + 49;
    zExp = 0x406E - shiftCount;
    if ( 64 <= shiftCount ) {
        zSig1 = 0;
        zSig0 = absA;
        shiftCount -= 64;
    }
    else {
        zSig1 = absA;
        zSig0 = 0;
    }
    shortShift128Left( zSig0, zSig1, shiftCount, &zSig0, &zSig1 );
    return packFloat128( zSign, zExp, zSig0, zSig1 );

}